

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O2

void __thiscall SubprocessTestSetWithMulti::Run(SubprocessTestSetWithMulti *this)

{
  Test *pTVar1;
  SubprocessTestSetWithMulti *pSVar2;
  bool bVar3;
  ExitStatus EVar4;
  Subprocess *pSVar5;
  string *psVar6;
  size_type sVar7;
  int i;
  long lVar8;
  allocator<char> local_99;
  SubprocessTestSetWithMulti *local_98;
  SubprocessSet *local_90;
  Subprocess *processes [3];
  char *kCommands [3];
  string local_50;
  
  kCommands[0] = "ls /";
  kCommands[1] = "id -u";
  kCommands[2] = "pwd";
  local_90 = &(this->super_SubprocessTest).subprocs_;
  lVar8 = 0;
  local_98 = this;
  do {
    if (lVar8 == 3) {
      bVar3 = testing::Test::Check
                        (g_current_test,
                         (long)(local_98->super_SubprocessTest).subprocs_.running_.
                               super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_98->super_SubprocessTest).subprocs_.running_.
                               super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                               _M_impl.super__Vector_impl_data._M_start == 0x18,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0xea,"3u == subprocs_.running_.size()");
      if (bVar3) {
        lVar8 = 0;
        goto LAB_00171857;
      }
      break;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,kCommands[lVar8],&local_99);
    pSVar5 = SubprocessSet::Add(local_90,&local_50,false);
    processes[lVar8] = pSVar5;
    std::__cxx11::string::~string((string *)&local_50);
    bVar3 = testing::Test::Check
                      (g_current_test,pSVar5 != (Subprocess *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0xe7,"(Subprocess *) 0 != processes[i]");
    lVar8 = lVar8 + 1;
  } while (bVar3);
  goto LAB_001718cf;
LAB_00171908:
  bVar3 = Subprocess::Done(processes[0]);
  if (((bVar3) && (bVar3 = Subprocess::Done(processes[1]), bVar3)) &&
     (bVar3 = Subprocess::Done(processes[2]), pSVar2 = local_98, bVar3)) {
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (bool)((local_98->super_SubprocessTest).subprocs_.token_available_ ^ 1),
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0xf6,"subprocs_.IsTokenAvailable()");
    if ((bVar3) &&
       (bVar3 = testing::Test::Check
                          (g_current_test,
                           (pSVar2->super_SubprocessTest).subprocs_.running_.
                           super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                           super__Vector_impl_data._M_finish ==
                           (pSVar2->super_SubprocessTest).subprocs_.running_.
                           super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                           ,0xf7,"0u == subprocs_.running_.size()"), pTVar1 = g_current_test, bVar3)
       ) {
      sVar7 = std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>::size
                        (&(pSVar2->super_SubprocessTest).subprocs_.finished_.c);
      bVar3 = testing::Test::Check
                        (pTVar1,sVar7 == 3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0xf8,"3u == subprocs_.finished_.size()");
      if (bVar3) {
        lVar8 = 0;
        goto LAB_00171a17;
      }
    }
    goto LAB_001718cf;
  }
  bVar3 = testing::Test::Check
                    (g_current_test,
                     (local_98->super_SubprocessTest).subprocs_.running_.
                     super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                     super__Vector_impl_data._M_finish !=
                     (local_98->super_SubprocessTest).subprocs_.running_.
                     super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0xf3,"subprocs_.running_.size() > 0u");
  if (!bVar3) goto LAB_001718cf;
  SubprocessSet::DoWork(local_90,(TokenPool *)0x0);
  goto LAB_00171908;
LAB_00171a17:
  pTVar1 = g_current_test;
  if (lVar8 == 3) {
    return;
  }
  pSVar5 = processes[lVar8];
  EVar4 = Subprocess::Finish(pSVar5);
  bVar3 = testing::Test::Check
                    (pTVar1,EVar4 == ExitSuccess,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0xfb,"ExitSuccess == processes[i]->Finish()");
  pTVar1 = g_current_test;
  if (!bVar3) goto LAB_001718cf;
  psVar6 = Subprocess::GetOutput_abi_cxx11_(pSVar5);
  bVar3 = std::operator!=("",psVar6);
  bVar3 = testing::Test::Check
                    (pTVar1,bVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0xfc,"\"\" != processes[i]->GetOutput()");
  if (!bVar3) goto LAB_001718cf;
  Subprocess::~Subprocess(pSVar5);
  operator_delete(pSVar5,0x30);
  lVar8 = lVar8 + 1;
  goto LAB_00171a17;
  while( true ) {
    psVar6 = Subprocess::GetOutput_abi_cxx11_(pSVar5);
    bVar3 = std::operator==("",psVar6);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0xed,"\"\" == processes[i]->GetOutput()");
    lVar8 = lVar8 + 1;
    if (!bVar3) break;
LAB_00171857:
    pTVar1 = g_current_test;
    if (lVar8 == 3) {
      (local_98->super_SubprocessTest).subprocs_.token_available_ = false;
      goto LAB_00171908;
    }
    pSVar5 = processes[lVar8];
    bVar3 = Subprocess::Done(pSVar5);
    bVar3 = testing::Test::Check
                      (pTVar1,!bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0xec,"processes[i]->Done()");
    pTVar1 = g_current_test;
    if (!bVar3) break;
  }
LAB_001718cf:
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(SubprocessTest, SetWithMulti) {
  Subprocess* processes[3];
  const char* kCommands[3] = {
    kSimpleCommand,
#ifdef _WIN32
    "cmd /c echo hi",
    "cmd /c time /t",
#else
    "id -u",
    "pwd",
#endif
  };

  for (int i = 0; i < 3; ++i) {
    processes[i] = subprocs_.Add(kCommands[i]);
    ASSERT_NE((Subprocess *) 0, processes[i]);
  }

  ASSERT_EQ(3u, subprocs_.running_.size());
  for (int i = 0; i < 3; ++i) {
    ASSERT_FALSE(processes[i]->Done());
    ASSERT_EQ("", processes[i]->GetOutput());
  }

  subprocs_.ResetTokenAvailable();
  while (!processes[0]->Done() || !processes[1]->Done() ||
         !processes[2]->Done()) {
    ASSERT_GT(subprocs_.running_.size(), 0u);
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());
  ASSERT_EQ(0u, subprocs_.running_.size());
  ASSERT_EQ(3u, subprocs_.finished_.size());

  for (int i = 0; i < 3; ++i) {
    ASSERT_EQ(ExitSuccess, processes[i]->Finish());
    ASSERT_NE("", processes[i]->GetOutput());
    delete processes[i];
  }
}